

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void __thiscall Json::Value::CZString::CZString(CZString *this,CZString *other)

{
  char *value;
  uint uVar1;
  
  value = other->cstr_;
  if (other->index_ != 0) {
    if (value == (char *)0x0) {
      value = (char *)0x0;
    }
    else {
      value = duplicateStringValue(value,0xffffffff);
    }
  }
  this->cstr_ = value;
  uVar1 = (uint)(other->index_ != 0);
  if (other->cstr_ == (char *)0x0) {
    uVar1 = other->index_;
  }
  this->index_ = uVar1;
  return;
}

Assistant:

Value::CZString::CZString(const CZString& other)
    : cstr_(other.index_ != noDuplication && other.cstr_ != 0
                ? duplicateStringValue(other.cstr_)
                : other.cstr_),
      index_(other.cstr_
                 ? (other.index_ == noDuplication ? noDuplication : duplicate)
                 : other.index_) {}